

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  DataType baseType;
  DataType baseType_00;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  long lVar4;
  TestNode *pTVar5;
  int iVar6;
  uint vecSize;
  int shaderType;
  ShaderType SVar7;
  int prec;
  Precision PVar8;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"abs","abs");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (lVar4 != 2) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            AbsCase::AbsCase((AbsCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                             iVar1 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sign","sign")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (lVar4 != 2) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            SignCase::SignCase((SignCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                               iVar1 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"floor",
             "floor");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            FloorCase::FloorCase
                      ((FloorCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"trunc",
             "trunc");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            TruncCase::TruncCase
                      ((TruncCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"round",
             "round");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            RoundCase::RoundCase
                      ((RoundCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"roundeven",
             "roundeven");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            RoundEvenCase::RoundEvenCase
                      ((RoundEvenCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ceil","ceil")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            CeilCase::CeilCase((CeilCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                               iVar1 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fract",
             "fract");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            FractCase::FractCase
                      ((FractCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"modf","modf")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            ModfCase::ModfCase((ModfCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                               iVar1 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"isnan",
             "isnan");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            IsnanCase::IsnanCase
                      ((IsnanCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"isinf",
             "isinf");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            IsinfCase::IsinfCase
                      ((IsinfCase *)pTVar3,(this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar6,
                       PVar8,SVar7);
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "floatbitstoint","floatbitstoint");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            FloatBitsToUintIntCase::FloatBitsToUintIntCase
                      ((FloatBitsToUintIntCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar6,PVar8,SVar7,true);
            pTVar3->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_0218da00;
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "floatbitstouint","floatbitstouint");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 0;
  do {
    if (1 < (int)lVar4 - 1U) {
      iVar1 = *(int *)(&DAT_01c57058 + lVar4 * 4);
      iVar6 = 1;
      do {
        PVar8 = PRECISION_LOWP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar3 = (TestNode *)operator_new(0x280);
            FloatBitsToUintIntCase::FloatBitsToUintIntCase
                      ((FloatBitsToUintIntCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar6,PVar8,SVar7,false);
            pTVar3->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_0218dac0;
            tcu::TestNode::addChild(pTVar2,pTVar3);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 == SHADERTYPE_FRAGMENT);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "intbitstofloat","intBitsToFloat() Tests");
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "uintbitstofloat","uintBitsToFloat() Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  vecSize = 1;
  do {
    baseType = TYPE_INT;
    if (1 < vecSize) {
      baseType = glu::getDataTypeIntVec(vecSize);
    }
    baseType_00 = TYPE_UINT;
    if (1 < vecSize) {
      baseType_00 = glu::getDataTypeUintVec(vecSize);
    }
    SVar7 = SHADERTYPE_VERTEX;
    do {
      pTVar5 = (TestNode *)operator_new(0x280);
      BitsToFloatCase::BitsToFloatCase
                ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,baseType,SVar7);
      tcu::TestNode::addChild(pTVar2,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x280);
      BitsToFloatCase::BitsToFloatCase
                ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,baseType_00,SVar7);
      tcu::TestNode::addChild(pTVar3,pTVar5);
      SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
    } while (SVar7 == SHADERTYPE_FRAGMENT);
    vecSize = vecSize + 1;
  } while (vecSize != 4);
  return extraout_EAX;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	//																	Float?	Int?	Uint?
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false);

	// (u)intBitsToFloat()
	{
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = glu::SHADERTYPE_VERTEX; shaderType <= glu::SHADERTYPE_FRAGMENT; shaderType++)
			{
				intGroup->addChild(new BitsToFloatCase(m_context, intType, glu::ShaderType(shaderType)));
				uintGroup->addChild(new BitsToFloatCase(m_context, uintType, glu::ShaderType(shaderType)));
			}
		}
	}
}